

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

CapTypes __thiscall ON_CurvePiping::CapType(ON_CurvePiping *this)

{
  ON_InternalXMLImpl *this_00;
  bool bVar1;
  ON_XMLVariant local_210;
  ON_XMLVariant local_118;
  undefined1 local_20 [8];
  ON_wString s;
  ON_CurvePiping *this_local;
  
  this_00 = &((this->super_ON_MeshModifier).m_impl)->super_ON_InternalXMLImpl;
  s.m_s = (wchar_t *)this;
  ::ON_XMLVariant::ON_XMLVariant(&local_210,L"");
  ON_InternalXMLImpl::GetParameter(&local_118,this_00,L"cap-type",&local_210);
  ::ON_XMLVariant::AsString((ON_XMLVariant *)local_20);
  ::ON_XMLVariant::~ON_XMLVariant(&local_118);
  ::ON_XMLVariant::~ON_XMLVariant(&local_210);
  bVar1 = ::operator==((ON_wString *)local_20,L"flat");
  if (bVar1) {
    this_local._4_4_ = Flat;
  }
  else {
    bVar1 = ::operator==((ON_wString *)local_20,L"box");
    if (bVar1) {
      this_local._4_4_ = Box;
    }
    else {
      bVar1 = ::operator==((ON_wString *)local_20,L"dome");
      if (bVar1) {
        this_local._4_4_ = Dome;
      }
      else {
        this_local._4_4_ = None;
      }
    }
  }
  ON_wString::~ON_wString((ON_wString *)local_20);
  return this_local._4_4_;
}

Assistant:

ON_CurvePiping::CapTypes ON_CurvePiping::CapType(void) const
{
  const ON_wString s = m_impl->GetParameter(ON_CURVE_PIPING_CAP_TYPE, L"").AsString();

  if (s == ON_CURVE_PIPING_FLAT) return ON_CurvePiping::CapTypes::Flat;
  if (s == ON_CURVE_PIPING_BOX)  return ON_CurvePiping::CapTypes::Box;
  if (s == ON_CURVE_PIPING_DOME) return ON_CurvePiping::CapTypes::Dome;

  return ON_CurvePiping::CapTypes::None;
}